

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O2

void amrex::single_level_weighted_redistribute
               (MultiFab *div_tmp_in,MultiFab *div_out,MultiFab *weights,int div_comp,int ncomp,
               Geometry *geom)

{
  EBCellFlagFab *this;
  FabType FVar1;
  EBFArrayBoxFactory *this_00;
  MultiFab *volfrac;
  int *piVar2;
  Box *in_stack_fffffffffffffed0;
  Box result_1;
  Box local_d4;
  Box result;
  MFIter mfi;
  
  EB_set_covered(div_tmp_in,0,ncomp,
                 (div_tmp_in->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
                 1e+40);
  mfi._0_12_ = Geometry::periodicity(geom);
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&div_tmp_in->super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  MultiFab::Copy(div_out,div_tmp_in,0,div_comp,ncomp,0);
  this_00 = (EBFArrayBoxFactory *)
            __dynamic_cast((div_out->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  if (this_00 != (EBFArrayBoxFactory *)0x0) {
    volfrac = EBFArrayBoxFactory::getVolFrac(this_00);
    MFIter::MFIter(&mfi,(FabArrayBase *)div_out,true);
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox(&local_d4,&mfi);
      piVar2 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar2 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      this = (EBCellFlagFab *)
             (div_out->super_FabArray<amrex::FArrayBox>).m_fabs_v.
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[*piVar2][1].super_BaseFab<double>._vptr_BaseFab;
      result.bigend.vect[2] = local_d4.bigend.vect[2];
      result.btype.itype = local_d4.btype.itype;
      result.smallend.vect[0] = local_d4.smallend.vect[0];
      result.smallend.vect[1] = local_d4.smallend.vect[1];
      FVar1 = EBCellFlagFab::getType(this,&result);
      if (FVar1 != covered) {
        result_1.bigend.vect[2] = local_d4.bigend.vect[2];
        result_1.btype.itype = local_d4.btype.itype;
        result_1.smallend.vect[0] = local_d4.smallend.vect[0];
        result_1.smallend.vect[1] = local_d4.smallend.vect[1];
        result_1.smallend.vect[2] = local_d4.smallend.vect[2] + -2;
        result_1.bigend.vect[0] = local_d4.bigend.vect[0] + 2;
        result_1.smallend.vect[1] = result_1.smallend.vect[1] + -2;
        result_1.smallend.vect[0] = result_1.smallend.vect[0] + -2;
        result_1.bigend.vect[1] = local_d4.bigend.vect[1] + 2;
        result_1.bigend.vect[2] = result_1.bigend.vect[2] + 2;
        FVar1 = EBCellFlagFab::getType(this,&result_1);
        if (FVar1 != regular) {
          apply_eb_redistribution
                    (&local_d4,div_out,div_tmp_in,weights,&mfi,div_comp,ncomp,this,volfrac,
                     in_stack_fffffffffffffed0,geom);
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void single_level_weighted_redistribute (MultiFab& div_tmp_in, MultiFab& div_out, const MultiFab& weights,
                                             int div_comp, int ncomp, const Geometry& geom)
    {
        Box domain(geom.Domain());

        Real covered_val = 1.e40;

        int nghost = 2;
        AMREX_ASSERT(div_tmp_in.nGrow() >= nghost);

        EB_set_covered(div_tmp_in, 0, ncomp, div_tmp_in.nGrow(), covered_val);

        div_tmp_in.FillBoundary(geom.periodicity());

        // Here we take care of both the regular and covered cases ... all we do below is the cut cell cases
        MultiFab::Copy(div_out, div_tmp_in, 0, div_comp, ncomp, 0);

        // Get EB geometric info
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(div_out.Factory());
        const MultiFab* volfrac   = &(ebfactory. getVolFrac());

        for (MFIter mfi(div_out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            // Tilebox
            const Box& bx = mfi.tilebox ();

            // this is to check efficiently if this tile contains any eb stuff
            const EBFArrayBox&  div_fab = static_cast<EBFArrayBox const&>(div_out[mfi]);
            const EBCellFlagFab&  flags = div_fab.getEBCellFlagFab();

            if ( !(flags.getType(amrex::grow(bx,     0)) == FabType::covered) &&
                 !(flags.getType(amrex::grow(bx,nghost)) == FabType::regular) )
            {
                // Compute div(tau) with EB algorithm
                apply_eb_redistribution(bx, div_out, div_tmp_in, weights, &mfi,
                                               div_comp, ncomp, flags, volfrac, domain,
                                               geom);

            }
        }
    }